

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O1

void GPU_SetRendererOrder(int order_size,GPU_RendererID *order)

{
  ulong uVar1;
  int count;
  GPU_RendererID default_order [10];
  int local_10c;
  GPU_RendererID local_108 [10];
  
  if (order == (GPU_RendererID *)0x0) {
    local_10c = 0;
    GPU_GetDefaultRendererOrder(&local_10c,local_108);
    GPU_SetRendererOrder(local_10c,local_108);
  }
  else {
    uVar1 = (ulong)(uint)order_size;
    if (0 < order_size) {
      if (10 < order_size) {
        GPU_PushErrorCode("GPU_SetRendererOrder",GPU_ERROR_USER_ERROR,
                          "Given order_size (%d) is greater than GPU_RENDERER_ORDER_MAX (%d)",uVar1,
                          10);
        uVar1 = 10;
      }
      memcpy(_gpu_renderer_order,order,uVar1 * 0x18);
      _gpu_renderer_order_size = (int)uVar1;
    }
  }
  return;
}

Assistant:

void GPU_SetRendererOrder(int order_size, GPU_RendererID* order)
{
    if(order == NULL)
    {
        // Restore the default order
        int count = 0;
        GPU_RendererID default_order[GPU_RENDERER_ORDER_MAX];
        GPU_GetDefaultRendererOrder(&count, default_order);
        GPU_SetRendererOrder(count, default_order);  // Call us again with the default order
        return;
    }
    
    if(order_size <= 0)
        return;
    
    if(order_size > GPU_RENDERER_ORDER_MAX)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Given order_size (%d) is greater than GPU_RENDERER_ORDER_MAX (%d)", order_size, GPU_RENDERER_ORDER_MAX);
        order_size = GPU_RENDERER_ORDER_MAX;
    }
    
    memcpy(_gpu_renderer_order, order, order_size*sizeof(GPU_RendererID));
    _gpu_renderer_order_size = order_size;
}